

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O0

int LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  int iVar1;
  int result;
  LZ4_stream_t *ctx;
  LZ4_stream_t ctxBody;
  int *piStack_20;
  int targetDstSize_local;
  int *srcSizePtr_local;
  char *dst_local;
  char *src_local;
  
  ctxBody.table[0x803]._4_4_ = targetDstSize;
  piStack_20 = srcSizePtr;
  srcSizePtr_local = (int *)dst;
  dst_local = src;
  iVar1 = LZ4_compress_destSize_extState((LZ4_stream_t *)&ctx,src,dst,srcSizePtr,targetDstSize);
  return iVar1;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOCATOR(1, sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}